

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PickLoadSigns.cpp
# Opt level: O3

void __thiscall wasm::PickLoadSigns::visitLocalSet(PickLoadSigns *this,LocalSet *curr)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  key_type local_20;
  Load *load;
  
  bVar2 = LocalSet::isTee(curr);
  if (!bVar2) {
    local_20 = (key_type)0x0;
    if ((((key_type)curr->value)->super_SpecificExpression<(wasm::Expression::Id)12>).
        super_Expression._id == LoadId) {
      local_20 = (key_type)curr->value;
    }
    if (local_20 != (key_type)0x0) {
      mVar1 = curr->index;
      pmVar3 = std::__detail::
               _Map_base<wasm::Load_*,_std::pair<wasm::Load_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Load_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Load_*>,_std::hash<wasm::Load_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Load_*,_std::pair<wasm::Load_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Load_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Load_*>,_std::hash<wasm::Load_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->loads,&local_20);
      *pmVar3 = mVar1;
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    if (curr->isTee()) {
      // we can't modify a tee, the value is used elsewhere
      return;
    }
    if (auto* load = curr->value->dynCast<Load>()) {
      loads[load] = curr->index;
    }
  }